

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQInteger __thiscall
SQFuncState::PushLocalVariable(SQFuncState *this,SQObject *name,bool assignable)

{
  size_type sVar1;
  ulong uVar2;
  long in_RDI;
  SQLocalVarInfo lvi;
  SQInteger pos;
  SQLocalVarInfo *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  
  sVar1 = sqvector<SQLocalVarInfo,_unsigned_int>::size
                    ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0x10));
  uVar2 = (ulong)sVar1;
  SQLocalVarInfo::SQLocalVarInfo(in_stack_ffffffffffffff80);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (SQObject *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  GetCurrentPos((SQFuncState *)0x1519a3);
  sVar1 = sqvector<SQLocalVarInfo,_unsigned_int>::size
                    ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0x10));
  sqvector<SQLocalVarInfo,_unsigned_int>::push_back
            ((sqvector<SQLocalVarInfo,_unsigned_int> *)CONCAT44(sVar1,in_stack_ffffffffffffff90),
             (SQLocalVarInfo *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar1 = sqvector<SQLocalVarInfo,_unsigned_int>::size
                    ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0x10));
  if (*(ulong *)(in_RDI + 0x40) < (ulong)sVar1) {
    sVar1 = sqvector<SQLocalVarInfo,_unsigned_int>::size
                      ((sqvector<SQLocalVarInfo,_unsigned_int> *)(in_RDI + 0x10));
    *(ulong *)(in_RDI + 0x40) = (ulong)sVar1;
  }
  SQLocalVarInfo::~SQLocalVarInfo((SQLocalVarInfo *)0x151a68);
  return uVar2;
}

Assistant:

SQInteger SQFuncState::PushLocalVariable(const SQObject &name, bool assignable)
{
    SQInteger pos=_vlocals.size();
    SQLocalVarInfo lvi;
    lvi._name=name;
    lvi._start_op=GetCurrentPos()+1;
    lvi._pos=_vlocals.size();
    lvi._assignable=assignable;
    _vlocals.push_back(lvi);
    if(_vlocals.size()>((SQUnsignedInteger)_stacksize))_stacksize=_vlocals.size();
    return pos;
}